

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O3

void subflow_task(uint W)

{
  U *pUVar1;
  _Atomic_word *p_Var2;
  code *pcVar3;
  double dVar4;
  undefined8 uVar5;
  default_delete<tf::Node> *pdVar6;
  default_delete<tf::Node> *pdVar7;
  char extraout_AL;
  bool bVar8;
  char extraout_AL_00;
  pointer *__ptr;
  default_delete<tf::Node> *this;
  int iVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_04;
  ResultBuilder DOCTEST_RB;
  Taskflow taskflow;
  Executor executor;
  anon_class_1_0_00000001 local_2f2;
  anon_class_1_0_00000001 local_2f1;
  ResultBuilder local_2f0;
  Future<void> local_278;
  shared_ptr<tf::WorkerInterface> local_258;
  anon_class_8_1_69701ed9 local_240;
  anon_class_8_1_69701ed9 local_238;
  undefined1 local_230 [80];
  default_delete<tf::Node> *local_1e0;
  default_delete<tf::Node> *pdStack_1d8;
  pointer local_1d0;
  _Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
  _Stack_1c8;
  bool local_170;
  Executor local_168;
  
  local_230._0_8_ = &local_1e0;
  local_230._8_8_ = 0;
  local_230._16_8_ = 0;
  local_230._24_8_ = 0;
  local_230._32_8_ = (__pthread_internal_list *)0x0;
  local_230._40_8_ = (__pthread_internal_list *)0x0;
  local_230._48_8_ = local_230 + 0x40;
  local_230._56_8_ = 0;
  local_230[0x40] = '\0';
  local_1e0 = (default_delete<tf::Node> *)0x0;
  pdStack_1d8 = (default_delete<tf::Node> *)0x0;
  local_1d0 = (pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map(&_Stack_1c8,0);
  local_170 = false;
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,(ulong)W,&local_258);
  if (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  iVar9 = 100;
  do {
    uVar5 = local_230._0_8_;
    local_2f0.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
    ((Node *)local_2f0.super_AssertData.m_test_case)->_nstate = 0;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_2f0.super_AssertData.m_test_case)->_name).field_2;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_name)._M_string_length = 0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_2f0.super_AssertData.m_test_case)->_edges).
              super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_data = (void *)0x0;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_parent = (Node *)0x0;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_num_successors = 0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_2f0.super_AssertData.m_test_case)->_join_counter;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_join_counter).
    super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)
     &(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ._M_u = 0;
    *(undefined8 *)
     ((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ._M_u + 8) = 0;
    *(code **)((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      ._M_u + 0x18) =
         std::
         _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:239:22)>
         ::_M_invoke;
    *(code **)((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      ._M_u + 0x10) =
         std::
         _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:239:22)>
         ::_M_manager;
    *(undefined8 *)
     ((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ._M_u + 0x20) = 0;
    *(undefined8 *)
     ((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ._M_u + 0x28) = 0;
    *(undefined8 *)
     ((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ._M_u + 0x30) = 0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_index = '\x03';
    (((Node *)local_2f0.super_AssertData.m_test_case)->_semaphores)._M_t.
    super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
         (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar5,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2f0);
    if ((Node *)local_2f0.super_AssertData.m_test_case != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_2f0,
                 (Node *)local_2f0.super_AssertData.m_test_case);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  if (*(char *)(doctest::detail::g_cs + 0x72) == '\0') {
    local_2f0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_2f0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_2f0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_2f0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_2f0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_2f0.super_AssertData.m_at = DT_REQUIRE_THROWS_WITH_AS;
    local_2f0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
    ;
    local_2f0.super_AssertData.m_line = 0xf5;
    local_2f0.super_AssertData.m_expr = "executor.run(taskflow).get()";
    local_2f0.super_AssertData.m_failed = true;
    local_2f0.super_AssertData.m_threw = false;
    local_2f0.super_AssertData.m_threw_as = false;
    local_2f0.super_AssertData.m_exception_type = "std::runtime_error";
    local_2f0.super_AssertData.m_exception_string = "x";
    local_240.repeat = 1;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              (&local_278,&local_168,(Taskflow *)local_230,&local_240,&local_2f2);
    std::future<void>::get(&local_278.super_future<void>);
    uVar10 = extraout_XMM0_Da;
    uVar11 = extraout_XMM0_Db;
    if (local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &(local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar9 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar9 = (local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (*(local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        uVar10 = extraout_XMM0_Da_00;
        uVar11 = extraout_XMM0_Db_00;
      }
    }
    if (local_278.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_278.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      uVar10 = extraout_XMM0_Da_01;
      uVar11 = extraout_XMM0_Db_01;
    }
    dVar4 = doctest::detail::ResultBuilder::log(&local_2f0,(double)CONCAT44(uVar11,uVar10));
    if (extraout_AL != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)(SUB84(dVar4,0));
      return;
    }
    if ((local_2f0.super_AssertData.m_failed == true) &&
       (bVar8 = doctest::detail::checkIfShouldThrow(local_2f0.super_AssertData.m_at), bVar8)) {
      doctest::detail::throwException();
    }
    if ((local_2f0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_2f0.super_AssertData.m_decomp.field_0._1_7_,
                         local_2f0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_2f0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_2f0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_2f0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_2f0.super_AssertData.m_exception.field_0._1_7_,
                         local_2f0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_2f0.super_AssertData.m_exception.field_0._1_7_,
                                         local_2f0.super_AssertData.m_exception.field_0.buf[0]));
    }
  }
  pdVar7 = pdStack_1d8;
  pdVar6 = local_1e0;
  this = local_1e0;
  if (pdStack_1d8 != local_1e0) {
    do {
      if (*(Node **)this != (Node *)0x0) {
        std::default_delete<tf::Node>::operator()(this,*(Node **)this);
      }
      *(undefined8 *)this = 0;
      this = this + 8;
    } while (this != pdVar7);
    pdStack_1d8 = pdVar6;
  }
  iVar9 = 100;
  do {
    uVar5 = local_230._0_8_;
    local_2f0.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
    ((Node *)local_2f0.super_AssertData.m_test_case)->_nstate = 0;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_2f0.super_AssertData.m_test_case)->_name).field_2;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_name)._M_string_length = 0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_2f0.super_AssertData.m_test_case)->_edges).
              super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_data = (void *)0x0;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_parent = (Node *)0x0;
    ((Node *)local_2f0.super_AssertData.m_test_case)->_num_successors = 0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_2f0.super_AssertData.m_test_case)->_join_counter;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_join_counter).
    super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)
     &(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ._M_u = 0;
    *(undefined8 *)
     ((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ._M_u + 8) = 0;
    *(code **)((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      ._M_u + 0x18) =
         std::
         _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:251:22)>
         ::_M_invoke;
    *(code **)((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      ._M_u + 0x10) =
         std::
         _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:251:22)>
         ::_M_manager;
    *(undefined8 *)
     ((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ._M_u + 0x20) = 0;
    *(undefined8 *)
     ((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ._M_u + 0x28) = 0;
    *(undefined8 *)
     ((long)&(((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ._M_u + 0x30) = 0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_index = '\x03';
    (((Node *)local_2f0.super_AssertData.m_test_case)->_semaphores)._M_t.
    super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
    (((Node *)local_2f0.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
         (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar5,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2f0);
    if ((Node *)local_2f0.super_AssertData.m_test_case != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_2f0,
                 (Node *)local_2f0.super_AssertData.m_test_case);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  if (*(char *)(doctest::detail::g_cs + 0x72) == '\0') {
    local_2f0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_2f0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_2f0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_2f0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_2f0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_2f0.super_AssertData.m_at = DT_REQUIRE_THROWS_WITH_AS;
    local_2f0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
    ;
    local_2f0.super_AssertData.m_line = 0x100;
    local_2f0.super_AssertData.m_expr = "executor.run(taskflow).get()";
    local_2f0.super_AssertData.m_failed = true;
    local_2f0.super_AssertData.m_threw = false;
    local_2f0.super_AssertData.m_threw_as = false;
    local_2f0.super_AssertData.m_exception_type = "std::runtime_error";
    local_2f0.super_AssertData.m_exception_string = "y";
    local_238.repeat = 1;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              (&local_278,&local_168,(Taskflow *)local_230,&local_238,&local_2f1);
    std::future<void>::get(&local_278.super_future<void>);
    uVar10 = extraout_XMM0_Da_02;
    uVar11 = extraout_XMM0_Db_02;
    if (local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &(local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar9 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar9 = (local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (*(local_278._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        uVar10 = extraout_XMM0_Da_03;
        uVar11 = extraout_XMM0_Db_03;
      }
    }
    if (local_278.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_278.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      uVar10 = extraout_XMM0_Da_04;
      uVar11 = extraout_XMM0_Db_04;
    }
    dVar4 = doctest::detail::ResultBuilder::log(&local_2f0,(double)CONCAT44(uVar11,uVar10));
    if (extraout_AL_00 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)(SUB84(dVar4,0));
      return;
    }
    if ((local_2f0.super_AssertData.m_failed == true) &&
       (bVar8 = doctest::detail::checkIfShouldThrow(local_2f0.super_AssertData.m_at), bVar8)) {
      doctest::detail::throwException();
    }
    if ((local_2f0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_2f0.super_AssertData.m_decomp.field_0._1_7_,
                         local_2f0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_2f0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_2f0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_2f0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_2f0.super_AssertData.m_exception.field_0._1_7_,
                         local_2f0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_2f0.super_AssertData.m_exception.field_0._1_7_,
                                         local_2f0.super_AssertData.m_exception.field_0.buf[0]));
    }
  }
  tf::Executor::~Executor(&local_168);
  tf::Taskflow::~Taskflow((Taskflow *)local_230);
  return;
}

Assistant:

void subflow_task(unsigned W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);
  
  // subflow work throws
  for(int i=0; i<100; i++) {
    taskflow.emplace([](tf::Subflow& sf){
      throw std::runtime_error("x");
      sf.emplace([](){});
      sf.emplace([](){ throw std::runtime_error("z"); });
    });
  }
  REQUIRE_THROWS_WITH_AS(executor.run(taskflow).get(), "x", std::runtime_error);

  taskflow.clear();
  
  // subflow's task throws
  for(int i=0; i<100; i++) {
    taskflow.emplace([](tf::Subflow& sf){
      sf.emplace([](){});
      sf.emplace([](){ throw std::runtime_error("y"); });
    });
  }
  REQUIRE_THROWS_WITH_AS(executor.run(taskflow).get(), "y", std::runtime_error);
}